

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<std::__cxx11::string_const&,int,int>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               int *args_1,int *args_2)

{
  int *in_R9;
  string local_28;
  
  StringPrintf<std::__cxx11::string_const&,int,int>
            (&local_28,(pbrt *)fmt,(char *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,args_2,
             in_R9);
  ErrorExit((FileLoc *)0x0,local_28._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}